

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_check_timer(mbedtls_ssl_context *ssl)

{
  int iVar1;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->f_get_timer == (mbedtls_ssl_get_timer_t *)0x0) {
    ssl_local._4_4_ = 0;
  }
  else {
    iVar1 = (*ssl->f_get_timer)(ssl->p_timer);
    if (iVar1 == 2) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x60,"timer expired");
      ssl_local._4_4_ = -1;
    }
    else {
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_check_timer( mbedtls_ssl_context *ssl )
{
    if( ssl->f_get_timer == NULL )
        return( 0 );

    if( ssl->f_get_timer( ssl->p_timer ) == 2 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "timer expired" ) );
        return( -1 );
    }

    return( 0 );
}